

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

bool cs::translator_type::compare(token_base *a,token_base *b)

{
  int iVar1;
  int iVar2;
  action_types aVar3;
  action_types aVar4;
  token_action *in_RSI;
  token_action *in_RDI;
  bool local_1d;
  bool local_1;
  
  if (in_RDI == (token_action *)0x0) {
    local_1 = in_RSI == (token_action *)0x0;
  }
  else if (in_RSI == (token_action *)0x0) {
    local_1 = in_RDI == (token_action *)0x0;
  }
  else {
    iVar1 = (*(in_RDI->super_token_base)._vptr_token_base[2])();
    iVar2 = (*(in_RSI->super_token_base)._vptr_token_base[2])();
    if (iVar1 == iVar2) {
      iVar1 = (*(in_RDI->super_token_base)._vptr_token_base[2])();
      local_1d = true;
      if (iVar1 == 2) {
        aVar3 = token_action::get_action(in_RDI);
        aVar4 = token_action::get_action(in_RSI);
        local_1d = aVar3 == aVar4;
      }
      local_1 = local_1d;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool compare(const token_base *a, const token_base *b)
		{
			if (a == nullptr)
				return b == nullptr;
			if (b == nullptr)
				return a == nullptr;
			if (a->get_type() != b->get_type())
				return false;
			return a->get_type() != token_types::action || static_cast<const token_action *>(a)->get_action() ==
			       static_cast<const token_action *>(b)->get_action();
		}